

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O2

void Bac_PtrFree(Vec_Ptr_t *vDes)

{
  Vec_Ptr_t *vNtk;
  int i;
  
  if (vDes != (Vec_Ptr_t *)0x0) {
    for (i = 1; i < vDes->nSize; i = i + 1) {
      vNtk = (Vec_Ptr_t *)Vec_PtrEntry(vDes,i);
      Bac_PtrFreeNtk(vNtk);
    }
    Vec_PtrFree(vDes);
    return;
  }
  return;
}

Assistant:

void Bac_PtrFree( Vec_Ptr_t * vDes )
{
    Vec_Ptr_t * vNtk; int i;
    if ( !vDes ) return;
    Vec_PtrForEachEntryStart( Vec_Ptr_t *, vDes, vNtk, i, 1 )
        Bac_PtrFreeNtk( vNtk );
    Vec_PtrFree( vDes );
}